

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O3

void ImTui_ImplNcurses_DrawScreen(bool active)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long *plVar12;
  uint uVar13;
  undefined7 in_register_00000039;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  timespec local_40;
  
  if ((int)CONCAT71(in_register_00000039,active) != 0) {
    nActiveFrames = 10;
  }
  wrefresh(_stdscr);
  uVar1 = g_screen->nx;
  uVar2 = g_screen->ny;
  lVar10 = (long)(int)uVar1;
  bVar5 = screenPrev.ny == uVar2;
  bVar6 = screenPrev.nx == uVar1;
  if ((!bVar5 || !bVar6) &&
     (iVar7 = uVar2 * uVar1, screenPrev.nx = uVar1, screenPrev.ny = uVar2, screenPrev.nmax < iVar7))
  {
    if (screenPrev.data != (TCell *)0x0) {
      operator_delete__(screenPrev.data);
      iVar7 = screenPrev.ny * screenPrev.nx;
    }
    uVar16 = 0xffffffffffffffff;
    if (-1 < iVar7) {
      uVar16 = (long)iVar7 * 4;
    }
    screenPrev.nmax = iVar7;
    screenPrev.data = (TCell *)operator_new__(uVar16);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&curs,lVar10 + 1);
  if (0 < (int)uVar2) {
    lVar15 = 0;
    uVar16 = 0;
    iVar7 = 0;
    do {
      if (bVar5 && bVar6) {
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            if (*(int *)((long)screenPrev.data + uVar11 * 4 + lVar15) !=
                *(int *)((long)g_screen->data + uVar11 * 4 + lVar15)) goto LAB_00105a67;
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
      }
      else {
LAB_00105a67:
        move(uVar16 & 0xffffffff,0);
        if (0 < (int)uVar1) {
          uVar13 = 0xffffffff;
          uVar11 = 0;
          do {
            uVar3 = *(uint *)((long)g_screen->data + uVar11 * 4 + lVar15);
            uVar14 = uVar3 >> 0x10 & 0xff | (uVar3 >> 0x18) << 8;
            if (colPairs._M_elems[uVar14].first == false) {
              init_pair((int)(short)nColPairs);
              colPairs._M_elems[uVar14].first = true;
              colPairs._M_elems[uVar14].second = nColPairs;
              nColPairs = nColPairs + 1;
            }
            if (uVar13 != uVar14) {
              if (curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                lVar17 = (long)iVar7;
                iVar7 = 0;
                curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17] = '\0';
                waddnstr(_stdscr,curs.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,0xffffffff);
                *curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start = '\0';
              }
              wattr_on(_stdscr,(colPairs._M_elems[uVar14].second & 0xffU) << 8,0);
              uVar13 = uVar14;
            }
            if ((short)uVar3 == 0) {
              uVar3 = 0x20;
            }
            lVar17 = (long)iVar7;
            iVar7 = iVar7 + 1;
            curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar17] = (uchar)uVar3;
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
        if (curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar17 = (long)iVar7;
          iVar7 = 0;
          curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar17] = '\0';
          waddnstr(_stdscr,curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,0xffffffff);
          *curs.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start = '\0';
        }
        if (bVar5 && bVar6) {
          memcpy(screenPrev.data + uVar16 * lVar10,g_screen->data + uVar16 * lVar10,lVar10 * 4);
        }
      }
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + lVar10 * 4;
    } while (uVar16 != uVar2);
  }
  if (!bVar5 || !bVar6) {
    memcpy(screenPrev.data,g_screen->data,(long)(int)(uVar2 * uVar1) << 2);
  }
  iVar7 = nActiveFrames;
  nActiveFrames = nActiveFrames + -1;
  lVar10 = std::chrono::_V2::system_clock::now();
  plVar12 = &_ZL7g_vsync_1;
  if (0 < iVar7) {
    plVar12 = &_ZL7g_vsync_0;
  }
  lVar15 = *plVar12;
  uVar11 = (_ZL7g_vsync_3 + lVar15) - 100;
  lVar17 = _ZL7g_vsync_3 + lVar15;
  uVar16 = lVar10 / 1000;
  if (uVar16 < uVar11) {
    auVar19._8_4_ = (int)((ulong)lVar17 >> 0x20);
    auVar19._0_8_ = lVar17;
    auVar19._12_4_ = 0x45300000;
    do {
      auVar20._8_4_ = (int)(uVar16 >> 0x20);
      auVar20._0_8_ = uVar16;
      auVar20._12_4_ = 0x45300000;
      auVar22._8_4_ = (int)((ulong)_ZL7g_vsync_0 >> 0x20);
      auVar22._0_8_ = _ZL7g_vsync_0;
      auVar22._12_4_ = 0x45300000;
      dVar18 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)_ZL7g_vsync_0) - 4503599627370496.0);
      if (dVar18 * 0.5 +
          (auVar20._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0) <
          (auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) {
        iVar7 = wgetch(_stdscr);
        if (iVar7 != -1) {
          ungetch(iVar7);
          return;
        }
        dVar18 = ((double)CONCAT44(0x45300000,(int)((ulong)_ZL7g_vsync_0 >> 0x20)) -
                 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)_ZL7g_vsync_0) - 4503599627370496.0);
      }
      uVar9 = (ulong)(dVar18 * 0.9);
      lVar10 = lVar17 - uVar16;
      auVar21._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar21._0_8_ = lVar10;
      auVar21._12_4_ = 0x45300000;
      dVar4 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) * 0.9;
      uVar16 = (ulong)dVar4;
      uVar9 = (long)(dVar18 * 0.9 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
      uVar16 = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16;
      if (uVar9 <= uVar16) {
        uVar16 = uVar9;
      }
      if (0 < (long)uVar16) {
        local_40.tv_sec = uVar16 / 1000000;
        local_40.tv_nsec = (uVar16 % 1000000) * 1000;
        do {
          iVar7 = nanosleep(&local_40,&local_40);
          if (iVar7 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
      }
      lVar10 = std::chrono::_V2::system_clock::now();
      uVar16 = lVar10 / 1000;
    } while (uVar16 < uVar11);
    lVar17 = lVar15 + _ZL7g_vsync_3;
  }
  _ZL7g_vsync_3 = lVar17;
  return;
}

Assistant:

void ImTui_ImplNcurses_DrawScreen(bool active) {
    if (active) nActiveFrames = 10;

    wrefresh(stdscr);

    int nx = g_screen->nx;
    int ny = g_screen->ny;

    bool compare = true;

    if (screenPrev.nx != nx || screenPrev.ny != ny) {
        screenPrev.resize(nx, ny);
        compare = false;
    }

    int ic = 0;
    curs.resize(nx + 1);

    for (int y = 0; y < ny; ++y) {
        bool isSame = compare;
        if (compare) {
            for (int x = 0; x < nx; ++x) {
                if (screenPrev.data[y*nx + x] != g_screen->data[y*nx + x]) {
                    isSame = false;
                    break;
                }
            }
        }
        if (isSame) continue;

        int lastp = 0xFFFFFFFF;
        move(y, 0);
        for (int x = 0; x < nx; ++x) {
            const auto cell = g_screen->data[y*nx + x];
            const uint16_t f = (cell & 0x00FF0000) >> 16;
            const uint16_t b = (cell & 0xFF000000) >> 24;
            const uint16_t p = b*256 + f;

            if (colPairs[p].first == false) {
                init_pair(nColPairs, f, b);
                colPairs[p].first = true;
                colPairs[p].second = nColPairs;
                ++nColPairs;
            }

            if (lastp != (int) p) {
                if (curs.size() > 0) {
                    curs[ic] = 0;
                    addstr((char *) curs.data());
                    ic = 0;
                    curs[0] = 0;
                }
                attron(COLOR_PAIR(colPairs[p].second));
                lastp = p;
            }

            const uint16_t c = cell & 0x0000FFFF;
            curs[ic++] = c > 0 ? c : ' ';
        }

        if (curs.size() > 0) {
            curs[ic] = 0;
            addstr((char *) curs.data());
            ic = 0;
            curs[0] = 0;
        }

        if (compare) {
            memcpy(screenPrev.data + y*nx, g_screen->data + y*nx, nx*sizeof(ImTui::TCell));
        }
    }

    if (!compare) {
        memcpy(screenPrev.data, g_screen->data, nx*ny*sizeof(ImTui::TCell));
    }

    g_vsync.wait(nActiveFrames --> 0);
}